

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

void free_StreamsInfo(_7z_stream_info *si)

{
  _7z_folder *p_Var1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  _7z_coder *__ptr;
  _7z_folder *p_Var5;
  ulong uVar6;
  
  free((si->pi).sizes);
  free((si->pi).positions);
  free((si->pi).digest.defineds);
  free((si->pi).digest.digests);
  p_Var5 = (si->ci).folders;
  if (p_Var5 != (_7z_folder *)0x0) {
    if ((si->ci).numFolders != 0) {
      uVar6 = 0;
      do {
        p_Var1 = (si->ci).folders;
        p_Var5 = p_Var1 + uVar6;
        __ptr = p_Var1[uVar6].coders;
        if (__ptr != (_7z_coder *)0x0) {
          if (p_Var5->numCoders != 0) {
            uVar3 = 0;
            uVar4 = 1;
            do {
              free(p_Var5->coders[uVar3].properties);
              bVar2 = uVar4 < p_Var5->numCoders;
              uVar3 = uVar4;
              uVar4 = (ulong)((int)uVar4 + 1);
            } while (bVar2);
            __ptr = p_Var5->coders;
          }
          free(__ptr);
        }
        free(p_Var5->bindPairs);
        free(p_Var5->packedStreams);
        free(p_Var5->unPackSize);
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (uVar6 < (si->ci).numFolders);
      p_Var5 = (si->ci).folders;
    }
    free(p_Var5);
  }
  free((si->ss).unpackSizes);
  free((si->ss).digestsDefined);
  free((si->ss).digests);
  return;
}

Assistant:

static void
free_StreamsInfo(struct _7z_stream_info *si)
{
	free_PackInfo(&(si->pi));
	free_CodersInfo(&(si->ci));
	free_SubStreamsInfo(&(si->ss));
}